

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableMergeDrawChannels(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  ImU32 *pIVar2;
  undefined8 *puVar3;
  int *piVar4;
  ImVector<unsigned_short> *pIVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImVector<ImDrawCmd> IVar9;
  char cVar10;
  char cVar11;
  byte bVar12;
  ImDrawListSplitter *pIVar13;
  ImGuiTableColumn *pIVar14;
  ImDrawCmd *pIVar15;
  ImDrawChannel *pIVar16;
  float *pfVar17;
  ImDrawChannel *pIVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  undefined8 uVar22;
  unsigned_short *puVar23;
  ImGuiContext *pIVar24;
  int n;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  ImBitArray<132,_0> *pIVar29;
  int iVar30;
  uint uVar31;
  int n_2;
  MergeGroup *this;
  MergeGroup *merge_group;
  uint uVar32;
  ImDrawChannel *pIVar33;
  int merge_group_sub_n;
  int iVar34;
  ulong uVar35;
  uint uVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  ImBitArray<132,_0> remaining_mask;
  MergeGroup merge_groups [4];
  
  pIVar24 = GImGui;
  pIVar13 = table->DrawSplitter;
  cVar10 = table->FreezeRowsCount;
  cVar11 = table->FreezeColumnsCount;
  memset(merge_groups,0,0xa0);
  uVar25 = 0;
  uVar32 = 0;
  do {
    if ((long)table->ColumnsCount <= (long)uVar25) {
      if (uVar32 != 0) {
        ImVector<ImDrawChannel>::resize(&pIVar24->DrawChannelsTempMergeBuffer,pIVar13->_Count + -2);
        pIVar33 = (pIVar24->DrawChannelsTempMergeBuffer).Data;
        remaining_mask.Storage[0] = 0;
        remaining_mask.Storage[1] = 0;
        remaining_mask.Storage[2] = 0;
        remaining_mask.Storage[3] = 0;
        remaining_mask.Storage[4] = 0;
        ImBitArraySetBitRange(remaining_mask.Storage,2,pIVar13->_Count);
        bVar12 = table->Bg2DrawChannelUnfrozen & 0x1f;
        remaining_mask.Storage[table->Bg2DrawChannelUnfrozen >> 5] =
             remaining_mask.Storage[table->Bg2DrawChannelUnfrozen >> 5] &
             (-2 << bVar12 | 0xfffffffeU >> 0x20 - bVar12);
        iVar34 = (pIVar13->_Count - (uint)('\0' < cVar10)) + -2;
        fVar37 = (table->HostClipRect).Min.x;
        fVar6 = (table->HostClipRect).Min.y;
        fVar7 = (table->HostClipRect).Max.x;
        fVar8 = (table->HostClipRect).Max.y;
        pIVar29 = &merge_groups[0].ChannelsMask;
        for (uVar25 = 0; uVar25 != 4; uVar25 = uVar25 + 1) {
          iVar27 = merge_groups[uVar25].ChannelsCount;
          if (iVar27 != 0) {
            fVar38 = merge_groups[uVar25].ClipRect.Min.x;
            fVar39 = merge_groups[uVar25].ClipRect.Min.y;
            fVar41 = merge_groups[uVar25].ClipRect.Max.x;
            fVar40 = merge_groups[uVar25].ClipRect.Max.y;
            if (((uVar25 & 1) == 0 || cVar11 < '\x01') && (fVar37 <= fVar38)) {
              fVar38 = fVar37;
            }
            if ((uVar25 < 2 || cVar10 < '\x01') && (fVar6 <= fVar39)) {
              fVar39 = fVar6;
            }
            if ((uVar25 & 1) != 0) {
              uVar32 = -(uint)(fVar7 <= fVar41);
              fVar41 = (float)(~uVar32 & (uint)fVar7 | (uint)fVar41 & uVar32);
            }
            if ((1 < uVar25) && ((table->Flags & 0x20000) == 0)) {
              uVar32 = -(uint)(fVar8 <= fVar40);
              fVar40 = (float)(~uVar32 & (uint)fVar8 | (uint)fVar40 & uVar32);
            }
            for (lVar28 = 0; lVar28 != 5; lVar28 = lVar28 + 1) {
              remaining_mask.Storage[lVar28] =
                   remaining_mask.Storage[lVar28] & ~pIVar29->Storage[lVar28];
            }
            uVar26 = 0;
            lVar28 = 8;
            iVar30 = iVar27;
            while (((long)uVar26 < (long)pIVar13->_Count && (iVar30 != 0))) {
              uVar35 = uVar26 >> 5 & 0x7ffffff;
              uVar32 = merge_groups[uVar25].ChannelsMask.Storage[uVar35];
              if ((uVar32 >> ((uint)uVar26 & 0x1f) & 1) != 0) {
                merge_groups[uVar25].ChannelsMask.Storage[uVar35] =
                     uVar32 & ~(1 << ((byte)uVar26 & 0x1f));
                iVar30 = iVar30 + -1;
                pIVar16 = (pIVar13->_Channels).Data;
                pfVar17 = *(float **)((long)&(pIVar16->_CmdBuffer).Size + lVar28);
                *pfVar17 = fVar38;
                pfVar17[1] = fVar39;
                pfVar17[2] = fVar41;
                pfVar17[3] = fVar40;
                puVar3 = (undefined8 *)((long)pIVar16 + lVar28 + -8);
                uVar22 = *puVar3;
                pIVar15 = (ImDrawCmd *)puVar3[1];
                piVar4 = (int *)((long)&(pIVar16->_CmdBuffer).Data + lVar28);
                iVar19 = piVar4[1];
                iVar20 = piVar4[2];
                iVar21 = piVar4[3];
                (pIVar33->_IdxBuffer).Size = *piVar4;
                (pIVar33->_IdxBuffer).Capacity = iVar19;
                *(int *)&(pIVar33->_IdxBuffer).Data = iVar20;
                *(int *)((long)&(pIVar33->_IdxBuffer).Data + 4) = iVar21;
                (pIVar33->_CmdBuffer).Size = (int)uVar22;
                (pIVar33->_CmdBuffer).Capacity = (int)((ulong)uVar22 >> 0x20);
                (pIVar33->_CmdBuffer).Data = pIVar15;
                pIVar33 = pIVar33 + 1;
              }
              uVar26 = uVar26 + 1;
              lVar28 = lVar28 + 0x20;
            }
            iVar34 = iVar34 - iVar27;
          }
          if (uVar25 == 1 && '\0' < cVar10) {
            pIVar18 = (pIVar13->_Channels).Data;
            pIVar16 = pIVar18 + table->Bg2DrawChannelUnfrozen;
            iVar30 = (pIVar16->_CmdBuffer).Size;
            iVar19 = (pIVar16->_CmdBuffer).Capacity;
            pIVar15 = (pIVar16->_CmdBuffer).Data;
            pIVar5 = &pIVar18[table->Bg2DrawChannelUnfrozen]._IdxBuffer;
            iVar27 = pIVar5->Capacity;
            puVar23 = pIVar5->Data;
            (pIVar33->_IdxBuffer).Size = pIVar5->Size;
            (pIVar33->_IdxBuffer).Capacity = iVar27;
            (pIVar33->_IdxBuffer).Data = puVar23;
            (pIVar33->_CmdBuffer).Size = iVar30;
            (pIVar33->_CmdBuffer).Capacity = iVar19;
            (pIVar33->_CmdBuffer).Data = pIVar15;
            pIVar33 = pIVar33 + 1;
          }
          pIVar29 = pIVar29 + 2;
        }
        lVar28 = 0;
        uVar25 = 0;
        while (((long)uVar25 < (long)pIVar13->_Count && (iVar34 != 0))) {
          if ((remaining_mask.Storage[uVar25 >> 5 & 0x7ffffff] >> ((uint)uVar25 & 0x1f) & 1) != 0) {
            pIVar16 = (pIVar13->_Channels).Data;
            IVar9 = *(ImVector<ImDrawCmd> *)((long)&(pIVar16->_CmdBuffer).Size + lVar28);
            puVar3 = (undefined8 *)((long)&(pIVar16->_IdxBuffer).Size + lVar28);
            uVar22 = *puVar3;
            puVar23 = (unsigned_short *)puVar3[1];
            (pIVar33->_IdxBuffer).Size = (int)uVar22;
            (pIVar33->_IdxBuffer).Capacity = (int)((ulong)uVar22 >> 0x20);
            (pIVar33->_IdxBuffer).Data = puVar23;
            pIVar33->_CmdBuffer = IVar9;
            pIVar33 = pIVar33 + 1;
            iVar34 = iVar34 + -1;
          }
          uVar25 = uVar25 + 1;
          lVar28 = lVar28 + 0x20;
        }
        memcpy((pIVar13->_Channels).Data + 2,(pIVar24->DrawChannelsTempMergeBuffer).Data,
               (long)pIVar13->_Count * 0x20 - 0x40);
      }
      return;
    }
    if ((table->VisibleMaskByIndex >> (uVar25 & 0x3f) & 1) != 0) {
      pIVar14 = (table->Columns).Data;
      for (iVar34 = 0; ('\0' < cVar10) + 1 != iVar34; iVar34 = iVar34 + 1) {
        bVar12 = *(byte *)((long)pIVar14 + (0x59 - (ulong)(iVar34 == 0)) + uVar25 * 0x68);
        pIVar33 = (pIVar13->_Channels).Data;
        iVar27 = pIVar33[bVar12]._CmdBuffer.Size;
        lVar28 = (long)iVar27;
        if (0 < lVar28) {
          pIVar33 = pIVar33 + bVar12;
          pIVar15 = (pIVar33->_CmdBuffer).Data;
          if ((pIVar15[lVar28 + -1].ElemCount == 0) &&
             (pIVar15[lVar28 + -1].UserCallback != (ImDrawCallback)0x0)) {
            iVar27 = iVar27 + -1;
            (pIVar33->_CmdBuffer).Size = iVar27;
          }
          if (iVar27 == 1) {
            if ((pIVar14[uVar25].Flags & 0x100) == 0) {
              if (cVar10 < '\x01') {
                fVar37 = pIVar14[uVar25].ContentMaxXUnfrozen;
LAB_00148601:
                uVar36 = -(uint)(pIVar14[uVar25].ContentMaxXHeadersUsed <= fVar37);
                fVar37 = (float)(~uVar36 & (uint)pIVar14[uVar25].ContentMaxXHeadersUsed |
                                (uint)fVar37 & uVar36);
              }
              else {
                if (iVar34 == 0) {
                  fVar37 = pIVar14[uVar25].ContentMaxXFrozen;
                  goto LAB_00148601;
                }
                fVar37 = pIVar14[uVar25].ContentMaxXUnfrozen;
              }
              pIVar1 = &pIVar14[uVar25].ClipRect.Max;
              if (pIVar1->x <= fVar37 && fVar37 != pIVar1->x) goto LAB_001486ae;
            }
            uVar36 = 1;
            if ('\0' < cVar11) {
              uVar36 = (uint)((long)table->FreezeColumnsCount <= (long)uVar25);
            }
            uVar31 = (uint)(iVar34 != 0) * 2;
            if (cVar10 < '\x01') {
              uVar31 = 2;
            }
            uVar31 = uVar31 | uVar36;
            this = merge_groups + uVar31;
            iVar27 = merge_groups[uVar31].ChannelsCount;
            if (iVar27 == 0) {
              (this->ClipRect).Min.x = 3.4028235e+38;
              (this->ClipRect).Min.y = 3.4028235e+38;
              merge_groups[uVar31].ClipRect.Max.x = -3.4028235e+38;
              merge_groups[uVar31].ClipRect.Max.y = -3.4028235e+38;
            }
            pIVar2 = merge_groups[uVar31].ChannelsMask.Storage + (bVar12 >> 5);
            *pIVar2 = *pIVar2 | 1 << (bVar12 & 0x1f);
            merge_groups[uVar31].ChannelsCount = iVar27 + 1;
            remaining_mask.Storage[0] = (ImU32)(pIVar15->ClipRect).x;
            remaining_mask.Storage[1] = (ImU32)(pIVar15->ClipRect).y;
            remaining_mask.Storage[2] = (ImU32)(pIVar15->ClipRect).z;
            remaining_mask.Storage[3] = (ImU32)(pIVar15->ClipRect).w;
            ImRect::Add(&this->ClipRect,(ImRect *)&remaining_mask);
            uVar32 = uVar32 | 1 << uVar31;
          }
        }
LAB_001486ae:
      }
      pIVar14[uVar25].DrawChannelCurrent = 0xff;
    }
    uVar25 = uVar25 + 1;
  } while( true );
}

Assistant:

void ImGui::TableMergeDrawChannels(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);
    IM_ASSERT(splitter->_Current == 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;

        MergeGroup() { ChannelsCount = 0; }
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0 && src_channel->_CmdBuffer.back().UserCallback != NULL) // Equivalent of PopUnusedDrawCmd()
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImGuiTableDrawChannelIdx)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0/Bg1) and 1 (Bg2 frozen) from the shuffling since they won't move - see channels allocation in TableSetupDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count);
        remaining_mask.ClearBit(table->Bg2DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, 0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg2DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0/Bg1 and Bg2 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg2DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}